

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

ImGuiColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  int iVar1;
  ImGuiColumns *pIVar2;
  ImGuiColumns *pIVar3;
  ImGuiColumns *pIVar4;
  int iVar5;
  int iVar6;
  ImGuiColumns *pIVar7;
  bool bVar8;
  ImGuiColumns local_b0;
  
  pIVar3 = (ImGuiColumns *)(long)(window->ColumnsStorage).Size;
  bVar8 = 0 < (long)pIVar3;
  if (0 < (long)pIVar3) {
    pIVar4 = (window->ColumnsStorage).Data;
    if (pIVar4->ID == id) {
      pIVar7 = (ImGuiColumns *)0x0;
    }
    else {
      pIVar2 = (ImGuiColumns *)0x1;
      do {
        pIVar7 = pIVar2;
        pIVar4 = pIVar4 + 1;
        if (pIVar3 == pIVar7) {
          bVar8 = pIVar7 < pIVar3;
          goto LAB_001ed4f8;
        }
        pIVar2 = (ImGuiColumns *)((long)&pIVar7->ID + 1);
      } while (pIVar4->ID != id);
      bVar8 = pIVar7 < pIVar3;
    }
    if ((window->ColumnsStorage).Size <= (int)pIVar7) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    pIVar3 = (window->ColumnsStorage).Data + (long)pIVar7;
  }
LAB_001ed4f8:
  if (!bVar8) {
    ImGuiColumns::ImGuiColumns(&local_b0);
    iVar6 = (window->ColumnsStorage).Size;
    iVar1 = (window->ColumnsStorage).Capacity;
    if (iVar6 == iVar1) {
      iVar6 = iVar6 + 1;
      if (iVar1 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar1 / 2 + iVar1;
      }
      if (iVar6 < iVar5) {
        iVar6 = iVar5;
      }
      if (iVar1 < iVar6) {
        pIVar4 = (ImGuiColumns *)MemAlloc((long)iVar6 * 0x88);
        pIVar3 = (window->ColumnsStorage).Data;
        if (pIVar3 != (ImGuiColumns *)0x0) {
          memcpy(pIVar4,pIVar3,(long)(window->ColumnsStorage).Size * 0x88);
          MemFree((window->ColumnsStorage).Data);
        }
        (window->ColumnsStorage).Data = pIVar4;
        (window->ColumnsStorage).Capacity = iVar6;
      }
    }
    memcpy((window->ColumnsStorage).Data + (window->ColumnsStorage).Size,&local_b0,0x88);
    (window->ColumnsStorage).Size = (window->ColumnsStorage).Size + 1;
    ImDrawListSplitter::ClearFreeMemory(&local_b0.Splitter);
    if (local_b0.Splitter._Channels.Data != (ImDrawChannel *)0x0) {
      MemFree(local_b0.Splitter._Channels.Data);
    }
    if (local_b0.Columns.Data != (ImGuiColumnData *)0x0) {
      MemFree(local_b0.Columns.Data);
    }
    if ((window->ColumnsStorage).Size < 1) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x60e,"back","ImGui ASSERT FAILED: %s","Size > 0");
    }
    pIVar3 = (window->ColumnsStorage).Data + (long)(window->ColumnsStorage).Size + -1;
    pIVar3->ID = id;
  }
  return pIVar3;
}

Assistant:

ImGuiColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiColumns());
    ImGuiColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}